

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int parse_json(char *s,int s_len,json_token *arr,int arr_len)

{
  int iVar1;
  frozen local_38;
  
  local_38.do_realloc = 0;
  local_38._36_4_ = 0;
  local_38.end = s + s_len;
  local_38.num_tokens = 0;
  local_38.max_tokens = arr_len;
  local_38.cur = s;
  local_38.tokens = arr;
  iVar1 = doit(&local_38);
  if (-1 < iVar1) {
    iVar1 = (int)local_38.cur - (int)s;
  }
  return iVar1;
}

Assistant:

int parse_json(const char *s, int s_len, struct json_token *arr, int arr_len) {
    struct frozen frozen;

    memset(&frozen, 0, sizeof(frozen));
    frozen.end = s + s_len;
    frozen.cur = s;
    frozen.tokens = arr;
    frozen.max_tokens = arr_len;

    TRY(doit(&frozen));

    return frozen.cur - s;
}